

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IdTable.cpp
# Opt level: O3

void __thiscall IdTable::IdTable(IdTable *this)

{
  _Elt_pointer piVar1;
  int local_1c;
  
  (this->index).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
  _M_finish._M_first = (_Elt_pointer)0x0;
  (this->index).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
  _M_finish._M_last = (_Elt_pointer)0x0;
  (this->index).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
  _M_start._M_node = (_Map_pointer)0x0;
  (this->index).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
  _M_finish._M_cur = (_Elt_pointer)0x0;
  (this->index).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
  _M_start._M_first = (_Elt_pointer)0x0;
  (this->index).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
  _M_start._M_last = (_Elt_pointer)0x0;
  (this->index).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
  _M_map_size = 0;
  (this->index).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
  _M_start._M_cur = (_Elt_pointer)0x0;
  (this->table).super__Vector_base<Id_*,_std::allocator<Id_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->index).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_map
       = (_Map_pointer)0x0;
  (this->table).super__Vector_base<Id_*,_std::allocator<Id_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->table).super__Vector_base<Id_*,_std::allocator<Id_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->index).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
  _M_finish._M_node = (_Map_pointer)0x0;
  std::_Deque_base<int,_std::allocator<int>_>::_M_initialize_map
            ((_Deque_base<int,_std::allocator<int>_> *)&this->index,0);
  local_1c = 0;
  piVar1 = (this->index).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (piVar1 == (this->index).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                super__Deque_impl_data._M_finish._M_last + -1) {
    std::deque<int,_std::allocator<int>_>::_M_push_back_aux<int>(&(this->index).c,&local_1c);
  }
  else {
    *piVar1 = 0;
    (this->index).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
    _M_finish._M_cur = piVar1 + 1;
  }
  return;
}

Assistant:

IdTable::IdTable(){
  index.push(0);
}